

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# characterhash.h
# Opt level: O2

void __thiscall
CharacterHash<unsigned_int,_unsigned_char>::CharacterHash
          (CharacterHash<unsigned_int,_unsigned_char> *this,uint maxval)

{
  uint32_conflict uVar1;
  size_t k;
  long lVar2;
  mersenneRNG randomgenerator;
  mersenneRNG mStack_13b8;
  
  MTRand::seed(&mStack_13b8.mtr);
  mStack_13b8.n = maxval;
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    uVar1 = mersenneRNG::operator()(&mStack_13b8);
    this->hashvalues[lVar2] = uVar1;
  }
  return;
}

Assistant:

CharacterHash(hashvaluetype maxval) {
    if (sizeof(hashvaluetype) <= 4) {
      mersenneRNG randomgenerator(maxval);
      for (size_t k = 0; k < nbrofchars; ++k)
        hashvalues[k] = static_cast<hashvaluetype>(randomgenerator());
    } else if (sizeof(hashvaluetype) == 8) {
      mersenneRNG randomgenerator(maxval >> 32);
      mersenneRNG randomgeneratorbase((maxval >> 32) == 0 ? maxval
                                                          : 0xFFFFFFFFU);
      for (size_t k = 0; k < nbrofchars; ++k)
        hashvalues[k] = static_cast<hashvaluetype>(randomgeneratorbase()) |
                        (static_cast<hashvaluetype>(randomgenerator()) << 32);
    } else
      throw runtime_error("unsupported hash value type");
  }